

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state.h
# Opt level: O0

void __thiscall Pool::~Pool(Pool *this)

{
  Pool *this_local;
  
  std::set<Edge_*,_Pool::WeightedEdgeCmp,_std::allocator<Edge_*>_>::~set(&this->delayed_);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

Pool(const std::string& name, int depth)
    : name_(name), current_use_(0), depth_(depth), delayed_() {}